

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void __thiscall
de::cmdline::Option<tcu::opt::CLDeviceIDs>::Option
          (Option<tcu::opt::CLDeviceIDs> *this,char *shortName_,char *longName_,char *description_,
          ParseFunc parse_,char *defaultValue_)

{
  char *defaultValue__local;
  ParseFunc parse__local;
  char *description__local;
  char *longName__local;
  char *shortName__local;
  Option<tcu::opt::CLDeviceIDs> *this_local;
  
  this->shortName = shortName_;
  this->longName = longName_;
  this->description = description_;
  this->defaultValue = defaultValue_;
  this->parse = parse_;
  this->namedValues = (NamedValue<std::vector<int,_std::allocator<int>_>_> *)0x0;
  this->namedValuesEnd = (NamedValue<std::vector<int,_std::allocator<int>_>_> *)0x0;
  return;
}

Assistant:

Option (const char* shortName_, const char* longName_, const char* description_, ParseFunc parse_, const char* defaultValue_ = DE_NULL)
		: shortName		(shortName_)
		, longName		(longName_)
		, description	(description_)
		, defaultValue	(defaultValue_)
		, parse			(parse_)
		, namedValues	(DE_NULL)
		, namedValuesEnd(DE_NULL)
	{
	}